

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringCacheTest.cpp
# Opt level: O0

void __thiscall
TEST_SimpleStringInternalCache_allocatingMultipleLargerStringThanCached_TestShell::
~TEST_SimpleStringInternalCache_allocatingMultipleLargerStringThanCached_TestShell
          (TEST_SimpleStringInternalCache_allocatingMultipleLargerStringThanCached_TestShell *this)

{
  TEST_SimpleStringInternalCache_allocatingMultipleLargerStringThanCached_TestShell *this_local;
  
  ~TEST_SimpleStringInternalCache_allocatingMultipleLargerStringThanCached_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(SimpleStringInternalCache, allocatingMultipleLargerStringThanCached)
{
    cache.setAllocator(allocator);

    char* mem = cache.alloc(1234);
    char* mem2 = cache.alloc(1234);
    char* mem3 = cache.alloc(1234);

    cache.dealloc(mem2, 1234);
    cache.dealloc(mem, 1234);
    cache.dealloc(mem3, 1234);

    LONGS_EQUAL(3, accountant.totalAllocationsOfSize(1234));
    LONGS_EQUAL(3, accountant.totalDeallocationsOfSize(1234));
}